

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

void __thiscall kj::MainBuilder::MainImpl::printHelp(MainImpl *this,StringPtr programName)

{
  ProcessContext *pPVar1;
  StringPtr indent;
  StringPtr indent_00;
  bool bVar2;
  int iVar3;
  Impl *pIVar4;
  reference ppVar5;
  char *pcVar6;
  reference ppOVar7;
  size_t sVar8;
  char **in_R8;
  char (*params_2) [62];
  pair<std::_Rb_tree_const_iterator<const_kj::MainBuilder::Impl::Option_*>,_bool> pVar9;
  Array<char> local_3d0;
  String local_3b8;
  StringPtr local_3a0;
  char local_389;
  char *local_388;
  size_t sStack_380;
  ArrayPtr<const_char> local_370;
  char local_359;
  StringPtr local_358;
  char *local_348;
  size_t sStack_340;
  StringPtr local_330;
  char local_319;
  String local_318;
  String local_300;
  String local_2e8;
  StringPtr local_2d0;
  OptionName *local_2c0;
  OptionName *name;
  OptionName *__end3;
  OptionName *__begin3;
  ArrayPtr<kj::MainBuilder::OptionName> *__range3;
  undefined1 local_298 [7];
  bool isFirst;
  Option *local_288;
  Option *opt;
  iterator __end2_3;
  iterator __begin2_3;
  set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
  *__range2_3;
  String local_258;
  char local_239;
  StringPtr local_238;
  char local_221;
  map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
  *local_220;
  size_t i;
  reference local_208;
  pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand> *command_1;
  iterator __end2_2;
  iterator __begin2_2;
  map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
  *__range2_2;
  reference local_1e0;
  pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand> *command;
  iterator __end2_1;
  iterator __begin2_1;
  map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
  *__range2_1;
  size_t maxLen;
  char (*local_1a8) [62];
  size_t sStack_1a0;
  StringPtr local_198;
  StringPtr local_188;
  StringPtr local_178;
  undefined1 local_168 [32];
  undefined1 local_148 [39];
  char local_121;
  Arg *local_120;
  Arg *arg;
  Arg *__end2;
  Arg *__begin2;
  Vector<kj::MainBuilder::Impl::Arg> *__range2;
  String local_f8;
  _Base_ptr local_e0;
  undefined1 local_d8;
  reference local_d0;
  pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*> *entry_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::CharArrayCompare,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
  *__range1_1;
  pair<const_char,_kj::MainBuilder::Impl::Option_*> *entry;
  iterator __end1;
  iterator __begin1;
  map<char,_kj::MainBuilder::Impl::Option_*,_std::less<char>,_std::allocator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>_>
  *__range1;
  set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
  sortedOptions;
  Vector<char> text;
  MainImpl *this_local;
  StringPtr programName_local;
  
  programName_local.content.ptr = (char *)programName.content.size_;
  this_local = (MainImpl *)programName.content.ptr;
  Vector<char>::Vector
            ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,0x400);
  std::
  set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
  ::set((set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
         *)&__range1);
  pIVar4 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
  __end1 = std::
           map<char,_kj::MainBuilder::Impl::Option_*,_std::less<char>,_std::allocator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>_>
           ::begin(&pIVar4->shortOptions);
  entry = (pair<const_char,_kj::MainBuilder::Impl::Option_*> *)
          std::
          map<char,_kj::MainBuilder::Impl::Option_*,_std::less<char>,_std::allocator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>_>
          ::end(&pIVar4->shortOptions);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&entry), bVar2) {
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>::
             operator*(&__end1);
    std::
    set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
    ::insert((set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
              *)&__range1,&ppVar5->second);
    std::_Rb_tree_iterator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>::operator++
              (&__end1);
  }
  pIVar4 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
  __end1_1 = std::
             map<kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::CharArrayCompare,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
             ::begin(&pIVar4->longOptions);
  entry_1 = (pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*> *)
            std::
            map<kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::CharArrayCompare,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
            ::end(&pIVar4->longOptions);
  while (bVar2 = std::operator!=(&__end1_1,(_Self *)&entry_1), bVar2) {
    local_d0 = std::
               _Rb_tree_iterator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>
               ::operator*(&__end1_1);
    pVar9 = std::
            set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
            ::insert((set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
                      *)&__range1,&local_d0->second);
    local_e0 = (_Base_ptr)pVar9.first._M_node;
    local_d8 = pVar9.second;
    std::
    _Rb_tree_iterator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>::
    operator++(&__end1_1);
  }
  bVar2 = std::
          set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
          ::empty((set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
                   *)&__range1);
  pcVar6 = " [<option>...]";
  if (bVar2) {
    pcVar6 = "";
  }
  __range2 = (Vector<kj::MainBuilder::Impl::Arg> *)pcVar6;
  str<char_const(&)[8],kj::StringPtr&,char_const*>
            (&local_f8,(kj *)"Usage: ",(char (*) [8])&this_local,(StringPtr *)&__range2,in_R8);
  Vector<char>::addAll<kj::String>
            ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_f8);
  String::~String(&local_f8);
  pIVar4 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
  bVar2 = std::
          map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
          ::empty(&pIVar4->subCommands);
  if (bVar2) {
    pIVar4 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
    __begin2 = (Arg *)&pIVar4->args;
    __end2 = Vector<kj::MainBuilder::Impl::Arg>::begin
                       ((Vector<kj::MainBuilder::Impl::Arg> *)__begin2);
    arg = Vector<kj::MainBuilder::Impl::Arg>::end((Vector<kj::MainBuilder::Impl::Arg> *)__begin2);
    for (; __end2 != arg; __end2 = __end2 + 1) {
      local_120 = __end2;
      local_121 = ' ';
      Vector<char>::add<char>
                ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 &local_121);
      if (local_120->minCount == 0) {
        local_148._0_8_ = "]";
        if (1 < local_120->maxCount) {
          local_148._0_8_ = "...]";
        }
        str<char_const(&)[2],kj::StringPtr&,char_const*>
                  ((String *)(local_148 + 8),(kj *)"[",(char (*) [2])local_120,
                   (StringPtr *)local_148,in_R8);
        Vector<char>::addAll<kj::String>
                  ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (String *)(local_148 + 8));
        String::~String((String *)(local_148 + 8));
      }
      else {
        local_168._0_8_ = "";
        if (1 < local_120->maxCount) {
          local_168._0_8_ = "...";
        }
        str<kj::StringPtr&,char_const*>
                  ((String *)(local_168 + 8),(kj *)local_120,(StringPtr *)local_168,
                   (char **)0x42d88a);
        Vector<char>::addAll<kj::String>
                  ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (String *)(local_168 + 8));
        String::~String((String *)(local_168 + 8));
      }
    }
  }
  else {
    StringPtr::StringPtr(&local_178," <command> [<arg>...]");
    Vector<char>::addAll<kj::StringPtr>
              ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
               &local_178);
  }
  StringPtr::StringPtr(&local_188,"\n\n");
  Vector<char>::addAll<kj::StringPtr>
            ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_188);
  StringPtr::StringPtr(&local_198,"");
  pIVar4 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
  params_2 = (char (*) [62])(pIVar4->briefDescription).content.ptr;
  sStack_1a0 = (pIVar4->briefDescription).content.size_;
  indent_00.content.size_ = local_198.content.size_;
  indent_00.content.ptr = local_198.content.ptr;
  local_1a8 = params_2;
  wrapText(this,(Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
           indent_00,(StringPtr)(pIVar4->briefDescription).content);
  pIVar4 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
  bVar2 = std::
          map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
          ::empty(&pIVar4->subCommands);
  pcVar6 = (char *)local_198.content.size_;
  if (!bVar2) {
    StringPtr::StringPtr((StringPtr *)&maxLen,"\nCommands:\n");
    Vector<char>::addAll<kj::StringPtr>
              ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (StringPtr *)&maxLen);
    __range2_1 = (map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                  *)0x0;
    pIVar4 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
    __end2_1 = std::
               map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
               ::begin(&pIVar4->subCommands);
    command = (pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand> *)
              std::
              map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
              ::end(&pIVar4->subCommands);
    while (bVar2 = std::operator!=(&__end2_1,(_Self *)&command), bVar2) {
      local_1e0 = std::
                  _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>
                  ::operator*(&__end2_1);
      __range2_2 = (map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                    *)StringPtr::size(&local_1e0->first);
      __range2_1 = (map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                    *)max<unsigned_long&,unsigned_long>
                                ((unsigned_long *)&__range2_1,(unsigned_long *)&__range2_2);
      std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>::
      operator++(&__end2_1);
    }
    pIVar4 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
    __end2_2 = std::
               map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
               ::begin(&pIVar4->subCommands);
    command_1 = (pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand> *)
                std::
                map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                ::end(&pIVar4->subCommands);
    while (bVar2 = std::operator!=(&__end2_2,(_Self *)&command_1), bVar2) {
      local_208 = std::
                  _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>
                  ::operator*(&__end2_2);
      StringPtr::StringPtr((StringPtr *)&i,"  ");
      Vector<char>::addAll<kj::StringPtr>
                ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (StringPtr *)&i);
      Vector<char>::addAll<kj::StringPtr_const&>
                ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 &local_208->first);
      for (local_220 = (map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                        *)StringPtr::size(&local_208->first); local_220 < __range2_1;
          local_220 = (map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                       *)&(local_220->_M_t)._M_impl.field_0x1) {
        local_221 = ' ';
        Vector<char>::add<char>
                  ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   &local_221);
      }
      StringPtr::StringPtr(&local_238,"  ");
      Vector<char>::addAll<kj::StringPtr>
                ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 &local_238);
      Vector<char>::addAll<kj::StringPtr&>
                ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 &(local_208->second).helpText);
      local_239 = '\n';
      Vector<char>::add<char>
                ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 &local_239);
      std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>::
      operator++(&__end2_2);
    }
    pcVar6 = " help <command>\' for more information on a specific command.\n";
    str<char_const(&)[7],kj::StringPtr&,char_const(&)[62]>
              (&local_258,(kj *)"\nSee \'",(char (*) [7])&this_local,
               (StringPtr *)" help <command>\' for more information on a specific command.\n",
               params_2);
    Vector<char>::addAll<kj::String>
              ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
               &local_258);
    String::~String(&local_258);
  }
  bVar2 = std::
          set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
          ::empty((set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
                   *)&__range1);
  if (!bVar2) {
    StringPtr::StringPtr((StringPtr *)&__range2_3,"\nOptions:\n");
    Vector<char>::addAll<kj::StringPtr>
              ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (StringPtr *)&__range2_3);
    __end2_3 = std::
               set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
               ::begin((set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
                        *)&__range1);
    opt = (Option *)
          std::
          set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
          ::end((set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
                 *)&__range1);
    while (bVar2 = std::operator!=(&__end2_3,(_Self *)&opt), bVar2) {
      ppOVar7 = std::_Rb_tree_const_iterator<const_kj::MainBuilder::Impl::Option_*>::operator*
                          (&__end2_3);
      local_288 = *ppOVar7;
      StringPtr::StringPtr((StringPtr *)local_298,"    ");
      Vector<char>::addAll<kj::StringPtr>
                ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (StringPtr *)local_298);
      __range3._7_1_ = 1;
      __begin3 = (OptionName *)local_288;
      __end3 = ArrayPtr<kj::MainBuilder::OptionName>::begin(&local_288->names);
      name = ArrayPtr<kj::MainBuilder::OptionName>::end
                       ((ArrayPtr<kj::MainBuilder::OptionName> *)__begin3);
      for (; __end3 != name; __end3 = __end3 + 1) {
        local_2c0 = __end3;
        if ((__range3._7_1_ & 1) == 0) {
          StringPtr::StringPtr(&local_2d0,", ");
          Vector<char>::addAll<kj::StringPtr>
                    ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count
                     ,&local_2d0);
        }
        else {
          __range3._7_1_ = 0;
        }
        if ((local_2c0->isLong & 1U) == 0) {
          str<char_const(&)[2],char_const&>
                    (&local_318,(kj *)0x42d80e,(char (*) [2])&local_2c0->field_1,pcVar6);
          Vector<char>::addAll<kj::String>
                    ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count
                     ,&local_318);
          String::~String(&local_318);
          if ((local_288->hasArg & 1U) != 0) {
            Vector<char>::addAll<kj::StringPtr_const&>
                      ((Vector<char> *)
                       &sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       &local_288->argTitle);
          }
        }
        else {
          str<char_const(&)[3],char_const*const&>
                    (&local_2e8,(kj *)"--",(char (*) [3])&local_2c0->field_1,(char **)pcVar6);
          Vector<char>::addAll<kj::String>
                    ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count
                     ,&local_2e8);
          String::~String(&local_2e8);
          if ((local_288->hasArg & 1U) != 0) {
            str<char_const(&)[2],kj::StringPtr_const&>
                      (&local_300,(kj *)"=",(char (*) [2])&local_288->argTitle,(StringPtr *)pcVar6);
            Vector<char>::addAll<kj::String>
                      ((Vector<char> *)
                       &sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_300);
            String::~String(&local_300);
          }
        }
      }
      local_319 = '\n';
      Vector<char>::add<char>
                ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 &local_319);
      StringPtr::StringPtr(&local_330,"        ");
      local_348 = (local_288->helpText).content.ptr;
      sStack_340 = (local_288->helpText).content.size_;
      indent.content.size_ = local_330.content.size_;
      indent.content.ptr = local_330.content.ptr;
      pcVar6 = (char *)local_330.content.size_;
      wrapText(this,(Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
               indent,(StringPtr)(local_288->helpText).content);
      std::_Rb_tree_const_iterator<const_kj::MainBuilder::Impl::Option_*>::operator++(&__end2_3);
    }
    StringPtr::StringPtr(&local_358,"    --help\n        Display this help text and exit.\n");
    Vector<char>::addAll<kj::StringPtr>
              ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
               &local_358);
  }
  pIVar4 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
  sVar8 = StringPtr::size(&pIVar4->extendedDescription);
  if (sVar8 != 0) {
    local_359 = '\n';
    Vector<char>::add<char>
              ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
               &local_359);
    StringPtr::StringPtr((StringPtr *)&local_370,"");
    pIVar4 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
    local_388 = (pIVar4->extendedDescription).content.ptr;
    sStack_380 = (pIVar4->extendedDescription).content.size_;
    wrapText(this,(Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (StringPtr)local_370,(StringPtr)(pIVar4->extendedDescription).content);
  }
  local_389 = '\0';
  Vector<char>::add<char>
            ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_389);
  pIVar4 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
  pPVar1 = pIVar4->context;
  Vector<char>::releaseAsArray
            (&local_3d0,
             (Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  String::String(&local_3b8,&local_3d0);
  StringPtr::StringPtr(&local_3a0,&local_3b8);
  iVar3 = (*pPVar1->_vptr_ProcessContext[5])(pPVar1,local_3a0.content.ptr,local_3a0.content.size_);
  Array<char>::~Array(&local_3d0);
  std::
  set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
  ::~set((set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
          *)&__range1);
  Vector<char>::~Vector
            ((Vector<char> *)&sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  _Unwind_Resume(iVar3);
}

Assistant:

void MainBuilder::MainImpl::printHelp(StringPtr programName) {
  Vector<char> text(1024);

  std::set<const Impl::Option*, Impl::OptionDisplayOrder> sortedOptions;

  for (auto& entry: impl->shortOptions) {
    sortedOptions.insert(entry.second);
  }
  for (auto& entry: impl->longOptions) {
    sortedOptions.insert(entry.second);
  }

  text.addAll(str("Usage: ", programName, sortedOptions.empty() ? "" : " [<option>...]"));

  if (impl->subCommands.empty()) {
    for (auto& arg: impl->args) {
      text.add(' ');
      if (arg.minCount == 0) {
        text.addAll(str("[", arg.title, arg.maxCount > 1 ? "...]" : "]"));
      } else {
        text.addAll(str(arg.title, arg.maxCount > 1 ? "..." : ""));
      }
    }
  } else {
    text.addAll(StringPtr(" <command> [<arg>...]"));
  }
  text.addAll(StringPtr("\n\n"));

  wrapText(text, "", impl->briefDescription);

  if (!impl->subCommands.empty()) {
    text.addAll(StringPtr("\nCommands:\n"));
    size_t maxLen = 0;
    for (auto& command: impl->subCommands) {
      maxLen = kj::max(maxLen, command.first.size());
    }
    for (auto& command: impl->subCommands) {
      text.addAll(StringPtr("  "));
      text.addAll(command.first);
      for (size_t i = command.first.size(); i < maxLen; i++) {
        text.add(' ');
      }
      text.addAll(StringPtr("  "));
      text.addAll(command.second.helpText);
      text.add('\n');
    }
    text.addAll(str(
        "\nSee '", programName, " help <command>' for more information on a specific command.\n"));
  }

  if (!sortedOptions.empty()) {
    text.addAll(StringPtr("\nOptions:\n"));

    for (auto opt: sortedOptions) {
      text.addAll(StringPtr("    "));
      bool isFirst = true;
      for (auto& name: opt->names) {
        if (isFirst) {
          isFirst = false;
        } else {
          text.addAll(StringPtr(", "));
        }
        if (name.isLong) {
          text.addAll(str("--", name.longName));
          if (opt->hasArg) {
            text.addAll(str("=", opt->argTitle));
          }
        } else {
          text.addAll(str("-", name.shortName));
          if (opt->hasArg) {
            text.addAll(opt->argTitle);
          }
        }
      }
      text.add('\n');
      wrapText(text, "        ", opt->helpText);
    }

    text.addAll(StringPtr("    --help\n        Display this help text and exit.\n"));
  }

  if (impl->extendedDescription.size() > 0) {
    text.add('\n');
    wrapText(text, "", impl->extendedDescription);
  }

  text.add('\0');
  impl->context.exitInfo(String(text.releaseAsArray()));
  KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT
}